

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrVirtualKeyboardLocationInfoMETA *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  bool bVar3;
  NextChainResult NVar4;
  ValidateXrHandleResult VVar5;
  pointer pcVar6;
  long lVar7;
  XrResult XVar8;
  string out;
  string local_278;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_240;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_228;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_210;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f8;
  string error_message;
  ios_base local_170 [264];
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  
  XVar8 = XR_SUCCESS;
  if (value->type != XR_TYPE_VIRTUAL_KEYBOARD_LOCATION_INFO_META) {
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrVirtualKeyboardLocationInfoMETA",
               value->type,"VUID-XrVirtualKeyboardLocationInfoMETA-type-type",
               XR_TYPE_VIRTUAL_KEYBOARD_LOCATION_INFO_META,
               "XR_TYPE_VIRTUAL_KEYBOARD_LOCATION_INFO_META");
    XVar8 = XR_ERROR_VALIDATION_FAILURE;
  }
  if (!check_pnext) goto LAB_001d84e0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  encountered_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  NVar4 = ValidateNextChain(instance_info,command_name,objects_info,value->next,&valid_ext_structs,
                            &encountered_structs,&duplicate_ext_structs);
  if (NVar4 == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
    error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&error_message,
               "Multiple structures of the same type(s) in \"next\" chain for ","");
    std::__cxx11::string::append((char *)&error_message);
    StructTypesToString_abi_cxx11_(&out,instance_info,&duplicate_ext_structs);
    std::__cxx11::string::_M_append((char *)&error_message,(ulong)out._M_dataplus._M_p);
    paVar1 = &out.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != paVar1) {
      operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
    }
    out._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&out,"VUID-XrVirtualKeyboardLocationInfoMETA-next-unique","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_210,objects_info);
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_278,
               "Multiple structures of the same type(s) in \"next\" chain for XrVirtualKeyboardLocationInfoMETA struct"
               ,"");
    CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,&local_210,
                        &local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if (local_210.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_210.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_210.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_210.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != paVar1) {
      operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)error_message._M_dataplus._M_p != &error_message.field_2) {
LAB_001d84b3:
      operator_delete(error_message._M_dataplus._M_p,error_message.field_2._M_allocated_capacity + 1
                     );
    }
LAB_001d84c3:
    XVar8 = XR_ERROR_VALIDATION_FAILURE;
  }
  else if (NVar4 == NEXT_CHAIN_RESULT_ERROR) {
    error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&error_message,"VUID-XrVirtualKeyboardLocationInfoMETA-next-next","");
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_1f8,objects_info);
    out._M_dataplus._M_p = (pointer)&out.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&out,
               "Invalid structure(s) in \"next\" chain for XrVirtualKeyboardLocationInfoMETA struct \"next\""
               ,"");
    CoreValidLogMessage(instance_info,&error_message,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        &local_1f8,&out);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != &out.field_2) {
      operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
    }
    if (local_1f8.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f8.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f8.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f8.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)error_message._M_dataplus._M_p != &error_message.field_2) goto LAB_001d84b3;
    goto LAB_001d84c3;
  }
  if (duplicate_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(duplicate_ext_structs.
                    super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)duplicate_ext_structs.
                          super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)duplicate_ext_structs.
                          super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
LAB_001d84e0:
  if (check_members && XVar8 == XR_SUCCESS) {
    error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&error_message,"XrVirtualKeyboardLocationInfoMETA","");
    paVar1 = &out.field_2;
    out._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&out,"locationType","");
    bVar3 = ValidateXrEnum(instance_info,command_name,&error_message,&out,objects_info,
                           value->locationType);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != paVar1) {
      operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)error_message._M_dataplus._M_p != &error_message.field_2) {
      operator_delete(error_message._M_dataplus._M_p,error_message.field_2._M_allocated_capacity + 1
                     );
    }
    if (bVar3) {
      VVar5 = VerifyXrSpaceHandle(&value->space);
      XVar8 = XR_SUCCESS;
      if (VVar5 != VALIDATE_XR_HANDLE_SUCCESS) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&error_message,"Invalid XrSpace handle \"space\" ",0x1f);
        local_278._M_dataplus._M_p = (pointer)value->space;
        out._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct((ulong)&out,'\x12');
        *out._M_dataplus._M_p = '0';
        out._M_dataplus._M_p[1] = 'x';
        pcVar6 = out._M_dataplus._M_p + (out._M_string_length - 1);
        lVar7 = 0;
        do {
          bVar2 = *(byte *)((long)&local_278._M_dataplus._M_p + lVar7);
          *pcVar6 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
          pcVar6[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
          lVar7 = lVar7 + 1;
          pcVar6 = pcVar6 + -2;
        } while (lVar7 != 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&error_message,out._M_dataplus._M_p,out._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)out._M_dataplus._M_p != paVar1) {
          operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
        }
        out._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&out,"VUID-XrVirtualKeyboardLocationInfoMETA-space-parameter","");
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_240,objects_info);
        std::__cxx11::stringbuf::str();
        CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                            &local_240,&local_278);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if (local_240.
            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_240.
                          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_240.
                                super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_240.
                                super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)out._M_dataplus._M_p != paVar1) {
          operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
        std::ios_base::~ios_base(local_170);
        XVar8 = XR_ERROR_HANDLE_INVALID;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&error_message,
                 "XrVirtualKeyboardLocationInfoMETA contains invalid XrVirtualKeyboardLocationTypeMETA \"locationType\" enum value "
                 ,0x6f);
      local_278._M_dataplus._M_p._0_4_ = value->locationType;
      out._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct((ulong)&out,'\n');
      *out._M_dataplus._M_p = '0';
      out._M_dataplus._M_p[1] = 'x';
      pcVar6 = out._M_dataplus._M_p + (out._M_string_length - 1);
      lVar7 = 0;
      do {
        bVar2 = *(byte *)((long)&local_278._M_dataplus._M_p + lVar7);
        *pcVar6 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
        pcVar6[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
        lVar7 = lVar7 + 1;
        pcVar6 = pcVar6 + -2;
      } while (lVar7 != 4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&error_message,out._M_dataplus._M_p,out._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out._M_dataplus._M_p != paVar1) {
        operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
      }
      out._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&out,"VUID-XrVirtualKeyboardLocationInfoMETA-locationType-parameter","");
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_228,objects_info);
      std::__cxx11::stringbuf::str();
      CoreValidLogMessage(instance_info,&out,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                          &local_228,&local_278);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if (local_228.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_228.
                        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_228.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_228.
                              super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out._M_dataplus._M_p != paVar1) {
        operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message);
      std::ios_base::~ios_base(local_170);
      XVar8 = XR_ERROR_VALIDATION_FAILURE;
    }
  }
  return XVar8;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrVirtualKeyboardLocationInfoMETA* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_VIRTUAL_KEYBOARD_LOCATION_INFO_META) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrVirtualKeyboardLocationInfoMETA",
                             value->type, "VUID-XrVirtualKeyboardLocationInfoMETA-type-type", XR_TYPE_VIRTUAL_KEYBOARD_LOCATION_INFO_META, "XR_TYPE_VIRTUAL_KEYBOARD_LOCATION_INFO_META");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrVirtualKeyboardLocationInfoMETA-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrVirtualKeyboardLocationInfoMETA struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrVirtualKeyboardLocationInfoMETA : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrVirtualKeyboardLocationInfoMETA-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrVirtualKeyboardLocationInfoMETA struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Make sure the enum type XrVirtualKeyboardLocationTypeMETA value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrVirtualKeyboardLocationInfoMETA", "locationType", objects_info, value->locationType)) {
        std::ostringstream oss_enum;
        oss_enum << "XrVirtualKeyboardLocationInfoMETA contains invalid XrVirtualKeyboardLocationTypeMETA \"locationType\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->locationType));
        CoreValidLogMessage(instance_info, "VUID-XrVirtualKeyboardLocationInfoMETA-locationType-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    {
        // writeValidateInlineHandleValidation
        ValidateXrHandleResult handle_result = VerifyXrSpaceHandle(&value->space);
        if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
            // Not a valid handle or NULL (which is not valid in this case)
            std::ostringstream oss;
            oss << "Invalid XrSpace handle \"space\" ";
            oss << HandleToHexString(value->space);
            CoreValidLogMessage(instance_info, "VUID-XrVirtualKeyboardLocationInfoMETA-space-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, oss.str());
            return XR_ERROR_HANDLE_INVALID;
        }
    }
    // Everything checked out properly
    return xr_result;
}